

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::annotation_of_the_boundary
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *map_a_ds,Simplex_handle *sigma,int dim_sigma)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar5;
  uint uVar6;
  Element EVar7;
  ulong uVar8;
  iterator __position;
  long *plVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long *plVar13;
  long *plVar14;
  uint uVar15;
  long *in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool> pVar16;
  int sign;
  Column *curr_col;
  Arith_element w_y;
  int local_2a4;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
  *local_2a0;
  Persistent_cohomology_column<unsigned_int,_int> *local_298;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_290;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  local_288;
  Boundary_simplex_range local_1c0;
  
  local_2a0 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
               *)map_a_ds;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>
    ::annotation_of_the_boundary();
  }
  lVar1 = *in_FS_OFFSET;
  if (in_FS_OFFSET[-3] != in_FS_OFFSET[-4]) {
    in_FS_OFFSET[-3] = in_FS_OFFSET[-4];
  }
  local_2a4 = (dim_sigma - (dim_sigma - (dim_sigma >> 0x1f) & 0x7ffffffeU)) * -2 + 1;
  local_290.m_ptr = sigma->m_ptr;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  boundary_simplex_range<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>
            (&local_1c0,this->cpx_,&local_290);
  local_288.next_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.next_;
  local_288.last_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.last_;
  local_288.suffix_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.suffix_.
       super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
       .m_holder.m_size;
  if (0x28 < local_1c0.
             super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.suffix_.
             super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
             .m_holder.m_size) {
    boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::on_capacity_overflow();
  }
  if (local_1c0.
      super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.suffix_.
      super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
      .m_holder.m_size != 0) {
    memcpy(&local_288.suffix_,
           &local_1c0.
            super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.suffix_,
           local_1c0.
           super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin.suffix_.
           super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
           .m_holder.m_size << 2);
  }
  local_288.sib_._0_4_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sib_._0_4_;
  local_288.sib_._4_4_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sib_._4_4_;
  local_288.sh_.m_ptr._0_4_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sh_.m_ptr._0_4_;
  local_288.sh_.m_ptr._4_4_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sh_.m_ptr._4_4_;
  local_288.st_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.st_;
  if (0x28 < local_1c0.
             super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End.suffix_.
             super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
             .m_holder.m_size) {
    boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::on_capacity_overflow();
  }
  while( true ) {
    ppVar5 = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)CONCAT44(local_288.sh_.m_ptr._4_4_,local_288.sh_.m_ptr._0_4_);
    if (ppVar5 == local_1c0.
                  super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                  .m_End.sh_.m_ptr) {
      lVar1 = in_FS_OFFSET[-4];
      lVar3 = in_FS_OFFSET[-3];
      if (lVar1 != lVar3) {
        uVar8 = lVar3 - lVar1 >> 4;
        lVar4 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>*,std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::annotation_of_the_boundary(std::map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>&,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int)::_lambda(std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&,std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&)_1_>>
                  (lVar1,lVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>*,std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::annotation_of_the_boundary(std::map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>&,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int)::_lambda(std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&,std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&)_1_>>
                  (lVar1,lVar3);
        plVar13 = (long *)in_FS_OFFSET[-4];
        plVar9 = (long *)in_FS_OFFSET[-3];
        if (plVar13 != plVar9) {
          do {
            lVar1 = *plVar13;
            iVar12 = (int)plVar13[1];
            plVar14 = plVar13;
            while ((plVar13 = plVar14 + 2, plVar13 != plVar9 && (*plVar13 == lVar1))) {
              iVar12 = iVar12 + (int)plVar14[3];
              plVar14 = plVar13;
            }
            if (iVar12 != 0) {
              plVar14 = *(long **)(lVar1 + 0x20);
              if (plVar14 != (long *)(lVar1 + 0x20)) {
                do {
                  uVar10 = (this->coeff_field_).Prime;
                  if ((int)uVar10 < 1) {
                    __assert_fail("Prime > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/include/gudhi/Persistent_cohomology/Field_Zp.h"
                                  ,0x41,
                                  "Element Gudhi::persistent_cohomology::Field_Zp::plus_times_equal(const Element &, const Element &, const Element &)"
                                 );
                  }
                  iVar11 = (*(int *)((long)plVar14 + 0x14) * iVar12) % (int)uVar10;
                  iVar11 = (iVar11 >> 0x1f & uVar10) + iVar11;
                  local_288.last_ = iVar11;
                  if (iVar11 != 0) {
                    local_1c0.
                    super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                    .m_Begin.last_ = *(uint *)(plVar14 + 2);
                    local_1c0.
                    super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                    .m_Begin.next_ = iVar11;
                    pVar16 = std::
                             _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                             ::_M_emplace_unique<std::pair<unsigned_int,int>>
                                       (local_2a0,(pair<unsigned_int,_int> *)&local_1c0);
                    __position._M_node = (_Base_ptr)pVar16.first._M_node;
                    if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                    {
                      local_1c0.
                      super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin.last_ = 1;
                      EVar7 = Field_Zp::plus_times_equal
                                        (&this->coeff_field_,
                                         (Element *)&__position._M_node[1].field_0x4,
                                         &local_288.last_,(Element *)&local_1c0);
                      *(Element *)&__position._M_node[1].field_0x4 = EVar7;
                      if (EVar7 == 0) {
                        std::
                        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                        ::erase_abi_cxx11_(local_2a0,__position);
                      }
                    }
                  }
                  plVar14 = (long *)*plVar14;
                } while (plVar14 != (long *)(lVar1 + 0x20));
                plVar9 = (long *)in_FS_OFFSET[-3];
              }
            }
          } while (plVar13 != plVar9);
        }
      }
      return;
    }
    if (ppVar5 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                   *)0x0) break;
    uVar10 = (ppVar5->second).super_Key_simplex_base.key_;
    uVar8 = (ulong)uVar10;
    if (uVar8 != 0xffffffff) {
      puVar2 = (this->dsets_).parent;
      uVar15 = puVar2[uVar8];
      uVar6 = uVar15;
      if (uVar15 != uVar10) {
        do {
          uVar10 = uVar6;
          uVar6 = puVar2[uVar10];
        } while (puVar2[uVar10] != uVar10);
      }
      for (; uVar10 != uVar15; uVar15 = puVar2[uVar15]) {
        puVar2[uVar8] = uVar10;
        uVar8 = (ulong)uVar15;
      }
      local_298 = (this->ds_repr_).
                  super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10];
      if (local_298 != (Persistent_cohomology_column<unsigned_int,_int> *)0x0) {
        std::
        vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>
        ::
        emplace_back<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*&,int&>
                  ((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>
                    *)(lVar1 + -0x20),&local_298,&local_2a4);
      }
    }
    local_2a4 = -local_2a4;
    Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
    ::increment(&local_288);
  }
  __assert_fail("sh_ != st_->null_simplex()",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree/Simplex_tree_iterators.h"
                ,0x8a,
                "const Simplex_handle &Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>::dereference() const [SimplexTree = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>]"
               );
}

Assistant:

void annotation_of_the_boundary(
      std::map<Simplex_key, Arith_element> & map_a_ds, Simplex_handle sigma,
      int dim_sigma) {
    // traverses the boundary of sigma, keeps track of the annotation vectors,
    // with multiplicity. We used to sum the coefficients directly in
    // annotations_in_boundary by using a map, we now do it later.
    typedef std::pair<Column *, int> annotation_t;
    thread_local std::vector<annotation_t> annotations_in_boundary;
    annotations_in_boundary.clear();
    int sign = 1 - 2 * (dim_sigma % 2);  // \in {-1,1} provides the sign in the
                                         // alternate sum in the boundary.
    Simplex_key key;
    Column * curr_col;

    for (auto sh : cpx_->boundary_simplex_range(sigma)) {
      key = cpx_->key(sh);
      if (key != cpx_->null_key()) {  // A simplex with null_key is a killer, and have null annotation
        // Find its annotation vector
        curr_col = ds_repr_[dsets_.find_set(key)];
        if (curr_col != NULL) {  // and insert it in annotations_in_boundary with multyiplicative factor "sign".
          annotations_in_boundary.emplace_back(curr_col, sign);
        }
      }
      sign = -sign;
    }
    // Place identical annotations consecutively so we can easily sum their multiplicities.
    std::sort(annotations_in_boundary.begin(), annotations_in_boundary.end(),
              [](annotation_t const& a, annotation_t const& b) { return a.first < b.first; });

    // Sum the annotations with multiplicity, using a map<key,coeff>
    // to represent a sparse vector.
    std::pair<typename std::map<Simplex_key, Arith_element>::iterator, bool> result_insert_a_ds;

    for (auto ann_it = annotations_in_boundary.begin(); ann_it != annotations_in_boundary.end(); /**/) {
      Column* col = ann_it->first;
      int mult = ann_it->second;
      while (++ann_it != annotations_in_boundary.end() && ann_it->first == col) {
        mult += ann_it->second;
      }
      // The following test is just a heuristic, it is not required, and it is fine that is misses p == 0.
      if (mult != coeff_field_.additive_identity()) {  // For all columns in the boundary,
        for (auto cell_ref : col->col_) {  // insert every cell in map_a_ds with multiplicity
          Arith_element w_y = coeff_field_.times(cell_ref.coefficient_, mult);  // coefficient * multiplicity

          if (w_y != coeff_field_.additive_identity()) {  // if != 0
            result_insert_a_ds = map_a_ds.insert(std::pair<Simplex_key, Arith_element>(cell_ref.key_, w_y));
            if (!(result_insert_a_ds.second)) {  // if cell_ref.key_ already a Key in map_a_ds
              result_insert_a_ds.first->second = coeff_field_.plus_equal(result_insert_a_ds.first->second, w_y);
              if (result_insert_a_ds.first->second == coeff_field_.additive_identity()) {
                map_a_ds.erase(result_insert_a_ds.first);
              }
            }
          }
        }
      }
    }
  }